

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRle.cpp
# Opt level: O2

int Imf_2_5::rleCompress(int inLength,char *in,char *out)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  char *pcVar8;
  
  iVar3 = (int)out;
  pcVar2 = in + inLength;
  pcVar4 = in;
LAB_001de821:
  do {
    if (pcVar2 <= in) {
      return (int)out - iVar3;
    }
    lVar7 = 0;
    pcVar8 = pcVar4;
    do {
      pcVar5 = pcVar8;
      pcVar8 = pcVar5 + 1;
      if (pcVar2 <= pcVar8) {
        lVar7 = 1 - lVar7;
        goto LAB_001de865;
      }
      lVar1 = lVar7 + ~(ulong)pcVar4;
      lVar7 = lVar7 + -1;
    } while ((-0x80 < (long)(in + lVar1)) && (*in == *pcVar8));
    lVar7 = -lVar7;
LAB_001de865:
    if ((long)(pcVar4 + (lVar7 - (long)in)) < 3) {
      cVar6 = (char)in - (char)pcVar8;
      lVar7 = (long)pcVar8 - (long)in;
      for (pcVar5 = pcVar5 + 3; pcVar4 = pcVar5 + -2, pcVar4 < pcVar2; pcVar5 = pcVar5 + 1) {
        if (((pcVar5 + -1 < pcVar2) && (*pcVar4 == pcVar5[-1])) && (pcVar5 < pcVar2)) {
          if ((0x7e < lVar7) || (*pcVar4 == *pcVar5)) break;
        }
        else if (0x7e < lVar7) break;
        cVar6 = cVar6 + -1;
        lVar7 = lVar7 + 1;
      }
      *out = cVar6;
      for (; out = out + 1, in < pcVar4; in = in + 1) {
        *out = *in;
      }
      goto LAB_001de821;
    }
    *out = (char)(pcVar4 + (lVar7 - (long)in)) + -1;
    out[1] = *in;
    out = out + 2;
    in = pcVar8;
    pcVar4 = pcVar8;
  } while( true );
}

Assistant:

int
rleCompress (int inLength, const char in[], signed char out[])
{
    const char *inEnd = in + inLength;
    const char *runStart = in;
    const char *runEnd = in + 1;
    signed char *outWrite = out;

    while (runStart < inEnd)
    {
	while (runEnd < inEnd &&
	       *runStart == *runEnd &&
	       runEnd - runStart - 1 < MAX_RUN_LENGTH)
	{
	    ++runEnd;
	}

	if (runEnd - runStart >= MIN_RUN_LENGTH)
	{
	    //
	    // Compressable run
	    //

	    *outWrite++ = (runEnd - runStart) - 1;
	    *outWrite++ = *(signed char *) runStart;
	    runStart = runEnd;
	}
	else
	{
	    //
	    // Uncompressable run
	    //

	    while (runEnd < inEnd &&
		   ((runEnd + 1 >= inEnd ||
		     *runEnd != *(runEnd + 1)) ||
		    (runEnd + 2 >= inEnd ||
		     *(runEnd + 1) != *(runEnd + 2))) &&
		   runEnd - runStart < MAX_RUN_LENGTH)
	    {
		++runEnd;
	    }

	    *outWrite++ = runStart - runEnd;

	    while (runStart < runEnd)
	    {
		*outWrite++ = *(signed char *) (runStart++);
	    }
	}

	++runEnd;
    }

    return outWrite - out;
}